

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

void ncnn::copy_make_border_image<float>(Mat *src,Mat *dst,int top,int left,int type,float v)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int x_1;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined4 *puVar10;
  int iVar11;
  undefined4 *puVar12;
  long lVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  ulong uVar19;
  
  uVar2 = dst->w;
  lVar13 = (long)(int)uVar2;
  iVar3 = dst->h;
  puVar18 = (undefined4 *)src->data;
  pvVar14 = dst->data;
  lVar5 = (long)left;
  if (type == 0) {
    iVar4 = 0;
    uVar19 = 0;
    if (0 < (int)uVar2) {
      uVar19 = (ulong)uVar2;
    }
    iVar15 = 0;
    if (0 < top) {
      iVar15 = top;
    }
    lVar1 = lVar13 * 4;
    for (; iVar4 != iVar15; iVar4 = iVar4 + 1) {
      for (uVar8 = 0; uVar19 != uVar8; uVar8 = uVar8 + 1) {
        *(float *)((long)pvVar14 + uVar8 * 4) = v;
      }
      pvVar14 = (void *)((long)pvVar14 + lVar1);
    }
    uVar8 = 0;
    if (0 < left) {
      uVar8 = (ulong)(uint)left;
    }
    for (; iVar15 < src->h + top; iVar15 = iVar15 + 1) {
      for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)((long)pvVar14 + uVar6 * 4) = v;
      }
      iVar4 = src->w;
      if ((long)iVar4 < 0xc) {
        for (uVar6 = uVar8; (long)uVar6 < (long)(left + iVar4); uVar6 = uVar6 + 1) {
          *(undefined4 *)((long)pvVar14 + uVar6 * 4) = puVar18[uVar6 - lVar5];
        }
      }
      else {
        memcpy((void *)(lVar5 * 4 + (long)pvVar14),puVar18,(long)iVar4 << 2);
        iVar4 = src->w;
        uVar6 = (ulong)(uint)(iVar4 + (int)uVar8);
      }
      for (lVar7 = (long)(int)uVar6; lVar7 < lVar13; lVar7 = lVar7 + 1) {
        *(float *)((long)pvVar14 + lVar7 * 4) = v;
      }
      puVar18 = puVar18 + iVar4;
      pvVar14 = (void *)((long)pvVar14 + lVar1);
    }
    for (; iVar15 < iVar3; iVar15 = iVar15 + 1) {
      for (uVar8 = 0; uVar19 != uVar8; uVar8 = uVar8 + 1) {
        *(float *)((long)pvVar14 + uVar8 * 4) = v;
      }
      pvVar14 = (void *)((long)pvVar14 + lVar1);
    }
  }
  puVar17 = puVar18;
  if (type == 1) {
    iVar4 = 0;
    uVar19 = 0;
    if (0 < left) {
      uVar19 = (ulong)(uint)left;
    }
    iVar15 = 0;
    if (0 < top) {
      iVar15 = top;
    }
    lVar1 = lVar13 * 4;
    puVar10 = (undefined4 *)((long)pvVar14 + uVar19 * 4);
    for (; iVar16 = (int)uVar19, iVar4 != iVar15; iVar4 = iVar4 + 1) {
      for (uVar8 = 0; uVar19 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)pvVar14 + uVar8 * 4) = *puVar18;
      }
      iVar11 = src->w;
      if ((long)iVar11 < 0xc) {
        for (uVar8 = uVar19; (long)uVar8 < (long)(iVar11 + left); uVar8 = uVar8 + 1) {
          *(undefined4 *)((long)pvVar14 + uVar8 * 4) = puVar18[uVar8 - lVar5];
        }
        iVar11 = src->w;
      }
      else {
        memcpy((void *)(lVar5 * 4 + (long)pvVar14),puVar18,(long)iVar11 << 2);
        iVar11 = src->w;
        uVar8 = (ulong)(uint)(iVar11 + iVar16);
      }
      for (lVar7 = (long)(int)uVar8; lVar7 < lVar13; lVar7 = lVar7 + 1) {
        *(undefined4 *)((long)pvVar14 + lVar7 * 4) = puVar18[iVar11 + -1];
      }
      pvVar14 = (void *)((long)pvVar14 + lVar1);
      puVar10 = puVar10 + lVar13;
    }
    for (; iVar15 < src->h + top; iVar15 = iVar15 + 1) {
      for (uVar8 = 0; uVar19 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)pvVar14 + uVar8 * 4) = *puVar18;
      }
      iVar4 = src->w;
      if ((long)iVar4 < 0xc) {
        for (uVar8 = uVar19; (long)uVar8 < (long)(iVar4 + left); uVar8 = uVar8 + 1) {
          *(undefined4 *)((long)pvVar14 + uVar8 * 4) = puVar18[uVar8 - lVar5];
        }
        iVar4 = src->w;
      }
      else {
        memcpy((void *)(lVar5 * 4 + (long)pvVar14),puVar18,(long)iVar4 << 2);
        iVar4 = src->w;
        uVar8 = (ulong)(uint)(iVar4 + iVar16);
      }
      for (lVar7 = (long)(int)uVar8; lVar7 < lVar13; lVar7 = lVar7 + 1) {
        *(undefined4 *)((long)pvVar14 + lVar7 * 4) = puVar18[iVar4 + -1];
      }
      puVar18 = puVar18 + iVar4;
      pvVar14 = (void *)((long)pvVar14 + lVar1);
      puVar10 = puVar10 + lVar13;
    }
    uVar8 = (ulong)src->w;
    puVar17 = puVar18 + -uVar8;
    lVar7 = uVar8 * 4;
    for (; iVar15 < iVar3; iVar15 = iVar15 + 1) {
      for (uVar6 = 0; uVar19 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined4 *)((long)pvVar14 + uVar6 * 4) = *puVar17;
      }
      if ((int)uVar8 < 0xc) {
        puVar12 = puVar10;
        for (uVar6 = uVar19; (long)uVar6 < (long)((int)uVar8 + left); uVar6 = uVar6 + 1) {
          *puVar12 = *(undefined4 *)((long)puVar18 + (uVar6 * 4 - (lVar5 * 4 + lVar7)));
          puVar12 = puVar12 + 1;
        }
        uVar2 = src->w;
      }
      else {
        memcpy((void *)(lVar5 * 4 + (long)pvVar14),puVar17,(uVar8 & 0xffffffff) << 2);
        uVar2 = src->w;
        uVar6 = (ulong)(uVar2 + iVar16);
      }
      uVar8 = (ulong)uVar2;
      for (lVar9 = (long)(int)uVar6; lVar9 < lVar13; lVar9 = lVar9 + 1) {
        *(undefined4 *)((long)pvVar14 + lVar9 * 4) = puVar17[(long)(int)uVar2 + -1];
      }
      pvVar14 = (void *)((long)pvVar14 + lVar1);
      puVar10 = puVar10 + lVar13;
    }
  }
  if (type == 2) {
    uVar2 = src->w;
    puVar17 = puVar17 + (int)(uVar2 * top);
    iVar4 = 0;
    uVar19 = 0;
    if (0 < left) {
      uVar19 = (ulong)(uint)left;
    }
    iVar15 = 0;
    if (0 < top) {
      iVar15 = top;
    }
    lVar1 = lVar13 * 4;
    puVar18 = (undefined4 *)(uVar19 * 4 + (long)pvVar14);
    iVar16 = left + -2;
    while( true ) {
      uVar8 = (ulong)uVar2;
      iVar11 = (int)uVar19;
      if (iVar4 == iVar15) break;
      puVar10 = puVar17 + lVar5;
      for (uVar6 = 0; uVar19 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined4 *)((long)pvVar14 + uVar6 * 4) = *puVar10;
        puVar10 = puVar10 + -1;
      }
      if ((int)uVar2 < 0xc) {
        for (uVar8 = uVar19; (long)uVar8 < (long)(int)(uVar2 + left); uVar8 = uVar8 + 1) {
          *(undefined4 *)((long)pvVar14 + uVar8 * 4) = puVar17[uVar8 - lVar5];
        }
        uVar2 = src->w;
      }
      else {
        memcpy((void *)(lVar5 * 4 + (long)pvVar14),puVar17,uVar8 << 2);
        uVar2 = src->w;
        uVar8 = (ulong)(uVar2 + iVar11);
      }
      iVar11 = (iVar16 + uVar2 * 2) - (int)uVar8;
      for (lVar7 = (long)(int)uVar8; lVar7 < lVar13; lVar7 = lVar7 + 1) {
        *(undefined4 *)((long)pvVar14 + lVar7 * 4) = puVar17[iVar11];
        iVar11 = iVar11 + -1;
      }
      pvVar14 = (void *)((long)pvVar14 + lVar1);
      puVar17 = puVar17 + -(long)(int)uVar2;
      iVar4 = iVar4 + 1;
      puVar18 = puVar18 + lVar13;
    }
    for (; iVar4 = (int)uVar8, iVar15 < src->h + top; iVar15 = iVar15 + 1) {
      puVar10 = puVar17 + lVar5;
      for (uVar6 = 0; uVar19 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined4 *)((long)pvVar14 + uVar6 * 4) = *puVar10;
        puVar10 = puVar10 + -1;
      }
      if (iVar4 < 0xc) {
        for (uVar6 = uVar19; (long)uVar6 < (long)(iVar4 + left); uVar6 = uVar6 + 1) {
          *(undefined4 *)((long)pvVar14 + uVar6 * 4) = puVar17[uVar6 - lVar5];
        }
        uVar2 = src->w;
      }
      else {
        memcpy((void *)(lVar5 * 4 + (long)pvVar14),puVar17,uVar8 << 2);
        uVar2 = src->w;
        uVar6 = (ulong)(uVar2 + iVar11);
      }
      uVar8 = (ulong)uVar2;
      iVar4 = (iVar16 + uVar2 * 2) - (int)uVar6;
      for (lVar7 = (long)(int)uVar6; lVar7 < lVar13; lVar7 = lVar7 + 1) {
        *(undefined4 *)((long)pvVar14 + lVar7 * 4) = puVar17[iVar4];
        iVar4 = iVar4 + -1;
      }
      puVar17 = puVar17 + (int)uVar2;
      pvVar14 = (void *)((long)pvVar14 + lVar1);
      puVar18 = puVar18 + lVar13;
    }
    puVar17 = puVar17 + -(long)(iVar4 * 2);
    for (; iVar15 < iVar3; iVar15 = iVar15 + 1) {
      puVar10 = puVar17 + lVar5;
      for (uVar6 = 0; uVar19 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined4 *)((long)pvVar14 + uVar6 * 4) = *puVar10;
        puVar10 = puVar10 + -1;
      }
      if ((int)uVar8 < 0xc) {
        puVar10 = puVar18;
        for (uVar6 = uVar19; (long)uVar6 < (long)((int)uVar8 + left); uVar6 = uVar6 + 1) {
          *puVar10 = puVar17[uVar6 - lVar5];
          puVar10 = puVar10 + 1;
        }
        uVar2 = src->w;
      }
      else {
        memcpy((void *)(lVar5 * 4 + (long)pvVar14),puVar17,uVar8 << 2);
        uVar2 = src->w;
        uVar6 = (ulong)(uVar2 + iVar11);
      }
      uVar8 = (ulong)uVar2;
      iVar4 = (iVar16 + uVar2 * 2) - (int)uVar6;
      for (lVar7 = (long)(int)uVar6; lVar7 < lVar13; lVar7 = lVar7 + 1) {
        *(undefined4 *)((long)pvVar14 + lVar7 * 4) = puVar17[iVar4];
        iVar4 = iVar4 + -1;
      }
      pvVar14 = (void *)((long)pvVar14 + lVar1);
      puVar17 = puVar17 + -(long)(int)uVar2;
      puVar18 = puVar18 + lVar13;
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}